

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

void __thiscall llvm::yaml::Output::newLineCheck(Output *this)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  raw_ostream *this_00;
  void *pvVar4;
  bool bVar5;
  ulong uVar6;
  size_t in_RCX;
  int iVar7;
  StringRef Str;
  StringRef Str_00;
  
  sVar3 = (this->Padding).Length;
  if ((sVar3 != 1) || (*(this->Padding).Data != '\n')) {
    this->Column = this->Column + (int)sVar3;
    raw_ostream::operator<<(this->Out,this->Padding);
    (this->Padding).Data = (char *)0x0;
    (this->Padding).Length = 0;
    return;
  }
  this_00 = this->Out;
  if (this_00->OutBufEnd == this_00->OutBufCur) {
    raw_ostream::write(this_00,0xe3236f,(void *)0x1,in_RCX);
  }
  else {
    *this_00->OutBufCur = '\n';
    this_00->OutBufCur = this_00->OutBufCur + 1;
  }
  this->Column = 0;
  (this->Padding).Data = (char *)0x0;
  (this->Padding).Length = 0;
  uVar1 = (this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
          super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
          super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase.
          Size;
  uVar6 = (ulong)uVar1;
  if (uVar6 == 0) {
    return;
  }
  iVar7 = uVar1 - 1;
  pvVar4 = (this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
           super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
           super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase.
           BeginX;
  uVar2 = *(uint *)((long)pvVar4 + uVar6 * 4 + -4);
  if (uVar2 < 2) {
LAB_00dad066:
    bVar5 = true;
    if (iVar7 == 0) goto LAB_00dad0c3;
  }
  else {
    if (uVar1 == 1) {
      return;
    }
    bVar5 = false;
    if ((uVar2 < 7) && (bVar5 = false, (0x5cU >> (uVar2 & 0x1f) & 1) != 0)) {
      if (*(uint *)((long)pvVar4 + uVar6 * 4 + -8) < 2) {
        iVar7 = uVar1 - 2;
        goto LAB_00dad066;
      }
      bVar5 = false;
    }
  }
  do {
    this->Column = this->Column + 2;
    Str.Length = 2;
    Str.Data = "  ";
    raw_ostream::operator<<(this->Out,Str);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  if (!bVar5) {
    return;
  }
LAB_00dad0c3:
  this->Column = this->Column + 2;
  Str_00.Length = 2;
  Str_00.Data = "- ";
  raw_ostream::operator<<(this->Out,Str_00);
  return;
}

Assistant:

void Output::newLineCheck() {
  if (Padding != "\n") {
    output(Padding);
    Padding = {};
    return;
  }
  outputNewLine();
  Padding = {};

  if (StateStack.size() == 0)
    return;

  unsigned Indent = StateStack.size() - 1;
  bool OutputDash = false;

  if (StateStack.back() == inSeqFirstElement ||
      StateStack.back() == inSeqOtherElement) {
    OutputDash = true;
  } else if ((StateStack.size() > 1) &&
             ((StateStack.back() == inMapFirstKey) ||
              inFlowSeqAnyElement(StateStack.back()) ||
              (StateStack.back() == inFlowMapFirstKey)) &&
             inSeqAnyElement(StateStack[StateStack.size() - 2])) {
    --Indent;
    OutputDash = true;
  }

  for (unsigned i = 0; i < Indent; ++i) {
    output("  ");
  }
  if (OutputDash) {
    output("- ");
  }

}